

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_store_in_memory_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::TrustStoreInMemoryTest::~TrustStoreInMemoryTest(TrustStoreInMemoryTest *this)

{
  TrustStoreInMemoryTest *this_local;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TrustStoreInMemoryTest_0093a108;
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&this->newintermediate_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&this->oldintermediate_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&this->target_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&this->newrootrollover_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&this->newroot_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&this->oldroot_);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

void SetUp() override {
    ParsedCertificateList chain;
    ASSERT_TRUE(ReadCertChainFromFile(
        "testdata/verify_certificate_chain_unittest/key-rollover/oldchain.pem",
        &chain));

    ASSERT_EQ(3U, chain.size());
    target_ = chain[0];
    oldintermediate_ = chain[1];
    oldroot_ = chain[2];
    ASSERT_TRUE(target_);
    ASSERT_TRUE(oldintermediate_);
    ASSERT_TRUE(oldroot_);

    ASSERT_TRUE(
        ReadCertChainFromFile("testdata/verify_certificate_chain_unittest/"
                              "key-rollover/longrolloverchain.pem",
                              &chain));

    ASSERT_EQ(5U, chain.size());
    newintermediate_ = chain[1];
    newroot_ = chain[2];
    newrootrollover_ = chain[3];
    ASSERT_TRUE(newintermediate_);
    ASSERT_TRUE(newroot_);
    ASSERT_TRUE(newrootrollover_);
  }